

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralComparators.hpp
# Opt level: O2

Comparison __thiscall
Kernel::LiteralComparators::LexComparator::compare(LexComparator *this,Literal *l1,Literal *l2)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  Comparison CVar6;
  SubtermIterator sit2;
  SubtermIterator sit1;
  
  uVar4 = ((uint)(l1->super_Term)._args[0]._content >> 2 & 1) + (l1->super_Term)._functor * 2;
  uVar5 = ((uint)(l2->super_Term)._args[0]._content >> 2 & 1) + (l2->super_Term)._functor * 2;
  if (uVar4 == uVar5) {
    SubtermIterator::SubtermIterator(&sit1,&l1->super_Term);
    SubtermIterator::SubtermIterator(&sit2,&l2->super_Term);
    CVar6 = LESS;
    do {
      while( true ) {
        bVar3 = SubtermIterator::hasNext(&sit1);
        if (!bVar3) {
          CVar6 = EQUAL;
          goto LAB_0043fd83;
        }
        SubtermIterator::hasNext(&sit2);
        sit1._used = true;
        uVar1 = **(ulong **)
                  (*(long *)((long)sit1._stack._self._M_t.
                                   super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                                   .
                                   super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>
                                   ._M_head_impl + 0x10) + -8);
        sit2._used = true;
        uVar2 = **(ulong **)
                  (*(long *)((long)sit2._stack._self._M_t.
                                   super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                                   .
                                   super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>
                                   ._M_head_impl + 0x10) + -8);
        if ((uVar1 & 3) == 0) break;
        if ((uVar2 & 3) == 0) goto LAB_0043fd83;
        uVar4 = (uint)(uVar1 >> 2);
        uVar5 = (uint)(uVar2 >> 2);
        if (uVar4 != uVar5) {
          bVar3 = uVar4 < uVar5;
          goto LAB_0043fd7a;
        }
      }
      if ((uVar2 & 3) != 0) {
        CVar6 = GREATER;
        goto LAB_0043fd83;
      }
    } while (*(uint *)(uVar1 + 8) == *(uint *)(uVar2 + 8));
    bVar3 = *(uint *)(uVar1 + 8) < *(uint *)(uVar2 + 8);
LAB_0043fd7a:
    CVar6 = -(uint)bVar3 | GREATER;
LAB_0043fd83:
    SubtermIterator::~SubtermIterator(&sit2);
    SubtermIterator::~SubtermIterator(&sit1);
  }
  else {
    CVar6 = -(uint)(uVar4 < uVar5) | GREATER;
  }
  return CVar6;
}

Assistant:

Comparison compare(Literal* l1, Literal* l2)
  {
    ASS(l1->shared());
    ASS(l2->shared());

    if(l1->header()!=l2->header()) {
      return Int::compare(l1->header(),l2->header());
    }

    SubtermIterator sit1(l1);
    SubtermIterator sit2(l2);
    while(sit1.hasNext()) {
      ALWAYS(sit2.hasNext());
      TermList st1=sit1.next();
      TermList st2=sit2.next();
      if(st1.isTerm()) {
	if(st2.isTerm()) {
	  unsigned f1=st1.term()->functor();
	  unsigned f2=st2.term()->functor();
	  if(f1!=f2) {
	    return Int::compare(f1,f2);
	  }
	} else {
	  return GREATER;
	}
      } else {
	if(st2.isTerm()) {
	  return LESS;
	} else {
	  if(st1.var()!=st2.var()) {
	    return Int::compare(st1.var(),st2.var());
	  }
	}
      }
    }
    ASS(l1==l2);
    return EQUAL;
  }